

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall
QTreeViewPrivate::widthHintForIndex
          (QTreeViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option,int i)

{
  Data *pDVar1;
  Data *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  QEditorInfo *pQVar5;
  Node<QWidget_*,_QHashDummyValue> *pNVar6;
  QSize QVar7;
  QSize QVar8;
  long *plVar9;
  int iVar10;
  long in_FS_OFFSET;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar9 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar5 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar1 = (pQVar5->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar5->widget).wp.value;
  }
  if (((local_40 != (QWidget *)0x0) &&
      (this_00 = (this->super_QAbstractItemViewPrivate).persistent.q_hash.d, this_00 != (Data *)0x0)
      ) && (pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                     findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)
                                        this_00,&local_40),
           pNVar6 != (Node<QWidget_*,_QHashDummyValue> *)0x0)) {
    iVar2 = (**(code **)(*(long *)local_40 + 0x70))();
    if (hint < iVar2) {
      hint = iVar2;
    }
    QVar7 = QWidget::minimumSize(local_40);
    QVar8 = QWidget::maximumSize(local_40);
    if (QVar8.wd.m_i.m_i <= hint) {
      hint = QVar8.wd.m_i.m_i;
    }
    if (hint <= QVar7.wd.m_i.m_i) {
      hint = QVar7.wd.m_i.m_i;
    }
  }
  plVar9 = (long *)(**(code **)(*plVar9 + 0x208))(plVar9,index);
  iVar3 = (**(code **)(*plVar9 + 0x68))(plVar9,option,index);
  iVar2 = index->c;
  iVar4 = this->treePosition;
  if (iVar4 < 0) {
    iVar4 = QHeaderView::logicalIndex(this->header,0);
  }
  iVar10 = 0;
  if (((-1 < i) && (iVar4 == iVar2)) && ((ulong)(uint)i < (ulong)(this->viewItems).d.size)) {
    iVar10 = ((uint)this->rootDecoration +
             (uint)*(ushort *)&(this->viewItems).d.ptr[(uint)i].field_0x20) * this->indent;
  }
  iVar2 = iVar3 + iVar10;
  if (iVar3 + iVar10 < hint) {
    iVar2 = hint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QTreeViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option, int i) const
{
    Q_Q(const QTreeView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    int xhint = q->itemDelegateForIndex(index)->sizeHint(option, index).width();
    hint = qMax(hint, xhint + (isTreePosition(index.column()) ? indentationForItem(i) : 0));
    return hint;
}